

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

int __thiscall BoardView::LoadFile(BoardView *this,path *filepath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ADFile *this_00;
  undefined4 extraout_var_04;
  shared_ptr<Pin> *p_1;
  long *plVar7;
  size_type sVar8;
  shared_ptr<Component> *p;
  vector<char,_std::allocator<char>_> buffer;
  path conffilepath;
  vector<char,_std::allocator<char>_> local_118;
  path local_100;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  path local_58;
  
  this->m_lastFileOpenWasInvalid = true;
  this->m_validBoard = false;
  sVar8 = (filepath->_M_pathname)._M_string_length;
  if (sVar8 == 0) {
    return 1;
  }
  if ((this->m_file != (BRDFile *)0x0) && (this->m_board != (Board *)0x0)) {
    iVar6 = (*this->m_board->_vptr_Board[3])();
    plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var,iVar6))[1];
    for (plVar7 = *(long **)CONCAT44(extraout_var,iVar6); plVar7 != plVar2; plVar7 = plVar7 + 2) {
      if (*(void **)(*plVar7 + 200) != (void *)0x0) {
        free(*(void **)(*plVar7 + 200));
      }
    }
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              (&this->m_pinHighlighted);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              (&this->m_partHighlighted);
    Annotations::Close(&this->m_annotations);
    iVar6 = (*this->m_board->_vptr_Board[2])();
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               CONCAT44(extraout_var_00,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[4])();
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
               CONCAT44(extraout_var_01,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[3])();
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT44(extraout_var_02,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[5])();
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
              ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
               CONCAT44(extraout_var_03,iVar6));
    sVar8 = (filepath->_M_pathname)._M_string_length;
  }
  pcVar3 = (filepath->_M_pathname)._M_dataplus._M_p;
  paVar1 = &local_100._M_pathname.field_2;
  local_100._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar3,pcVar3 + sVar8);
  std::__cxx11::string::_M_assign((string *)&this->m_lastFileOpenName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_pathname._M_dataplus._M_p,
                    local_100._M_pathname.field_2._M_allocated_capacity + 1);
  }
  file_as_buffer(&local_118,filepath);
  if (local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_0013e254;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".fz","");
  bVar4 = check_fileext(filepath,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    this_00 = (ADFile *)operator_new(0x98);
    FZFile::FZFile((FZFile *)this_00,&local_118,this->FZKey);
LAB_0013e0db:
    if ((this_00->super_BRDFile).valid == true) {
      SetFile(this,&this_00->super_BRDFile);
      pcVar3 = (filepath->_M_pathname)._M_dataplus._M_p;
      local_100._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,pcVar3,pcVar3 + (filepath->_M_pathname)._M_string_length);
      FHistory::Prepend_save(&this->fhistory,&local_100._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._M_pathname._M_dataplus._M_p,
                        local_100._M_pathname.field_2._M_allocated_capacity + 1);
      }
      this->history_file_has_changed = 1;
      this->boardMinMaxDone = false;
      this->m_rotation = 0;
      this->m_current_side = 0;
      EPCCheck(this);
      pcVar3 = (filepath->_M_pathname)._M_dataplus._M_p;
      local_100._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,pcVar3,pcVar3 + (filepath->_M_pathname)._M_string_length);
      Annotations::SetFilename(&this->m_annotations,&local_100._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._M_pathname._M_dataplus._M_p,
                        local_100._M_pathname.field_2._M_allocated_capacity + 1);
      }
      Annotations::Load(&this->m_annotations);
      std::filesystem::__cxx11::path::path(&local_100,filepath);
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_58,(char (*) [5])0x1de3e2,auto_format);
      std::filesystem::__cxx11::path::replace_extension(&local_100);
      std::filesystem::__cxx11::path::~path(&local_58);
      BackgroundImage::loadFromConfig(&this->backgroundImage,&local_100);
      iVar6 = (*this->m_board->_vptr_Board[4])();
      plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_04,iVar6))[1];
      for (plVar7 = *(long **)CONCAT44(extraout_var_04,iVar6); plVar7 != plVar2; plVar7 = plVar7 + 2
          ) {
        *(undefined4 *)(*plVar7 + 0x58) = 0x40e00000;
      }
      CenterView(this);
      this->m_lastFileOpenWasInvalid = false;
      this->m_validBoard = true;
      std::filesystem::__cxx11::path::~path(&local_100);
      goto LAB_0013e254;
    }
    this->m_validBoard = false;
    BRDFile::~BRDFile(&this_00->super_BRDFile);
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,".bom","");
    bVar4 = check_fileext(filepath,&local_98);
    bVar5 = true;
    if (!bVar4) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,".asc","");
      bVar5 = check_fileext(filepath,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar5 != false) {
      this_00 = (ADFile *)operator_new(0x80);
      ASCFile::ASCFile((ASCFile *)this_00,&local_118,filepath);
      goto LAB_0013e0db;
    }
    bVar4 = ADFile::verifyFormat(&local_118);
    if (bVar4) {
      this_00 = (ADFile *)operator_new(200);
      ADFile::ADFile(this_00,&local_118);
      goto LAB_0013e0db;
    }
    bVar4 = CADFile::verifyFormat(&local_118);
    if (bVar4) {
      this_00 = (ADFile *)operator_new(0x80);
      CADFile::CADFile((CADFile *)this_00,&local_118);
      goto LAB_0013e0db;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,".cst","");
    bVar4 = check_fileext(filepath,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      this_00 = (ADFile *)operator_new(0x98);
      CSTFile::CSTFile((CSTFile *)this_00,&local_118);
      goto LAB_0013e0db;
    }
    bVar4 = BRDFile::verifyFormat(&local_118);
    if (bVar4) {
      this_00 = (ADFile *)operator_new(0x80);
      BRDFile::BRDFile((BRDFile *)this_00,&local_118);
      goto LAB_0013e0db;
    }
    bVar4 = BRD2File::verifyFormat(&local_118);
    if (bVar4) {
      this_00 = (ADFile *)operator_new(0x80);
      BRD2File::BRD2File((BRD2File *)this_00,&local_118);
      goto LAB_0013e0db;
    }
    bVar4 = BDVFile::verifyFormat(&local_118);
    if (bVar4) {
      this_00 = (ADFile *)operator_new(0x80);
      BDVFile::BDVFile((BDVFile *)this_00,&local_118);
      goto LAB_0013e0db;
    }
    bVar4 = BVRFile::verifyFormat(&local_118);
    if (bVar4) {
      this_00 = (ADFile *)operator_new(0x80);
      BVRFile::BVRFile((BVRFile *)this_00,&local_118);
      goto LAB_0013e0db;
    }
    this->m_validBoard = false;
    this_00 = (ADFile *)0x0;
  }
  operator_delete(this_00,0x80);
LAB_0013e254:
  if (local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int BoardView::LoadFile(const filesystem::path &filepath) {
	m_lastFileOpenWasInvalid = true;
	m_validBoard             = false;
	if (!filepath.empty()) {
		// clean up the previous file.
		if (m_file && m_board) {
			for (auto &p : m_board->Components()) {
				if (p->hull) free(p->hull);
			}
			m_pinHighlighted.clear();
			m_partHighlighted.clear();
			m_annotations.Close();
			m_board->Nets().clear();
			m_board->Pins().clear();
			m_board->Components().clear();
			m_board->OutlinePoints().clear();
			//	delete m_file;
			// delete m_board;
		}

		SetLastFileOpenName(filepath.string());
		std::vector<char> buffer = file_as_buffer(filepath);
		if (!buffer.empty()) {
			BRDFile *file = nullptr;

			if (check_fileext(filepath, ".fz")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				file = new FZFile(buffer, FZKey);
			} else if (check_fileext(filepath, ".bom") || check_fileext(filepath, ".asc"))
				file = new ASCFile(buffer, filepath);
			else if (ADFile::verifyFormat(buffer))
				file = new ADFile(buffer);
			else if (CADFile::verifyFormat(buffer))
				file = new CADFile(buffer);
			else if (check_fileext(filepath, ".cst"))
				file = new CSTFile(buffer);
			else if (BRDFile::verifyFormat(buffer))
				file = new BRDFile(buffer);
			else if (BRD2File::verifyFormat(buffer))
				file = new BRD2File(buffer);
			else if (BDVFile::verifyFormat(buffer))
				file = new BDVFile(buffer);
			else if (BVRFile::verifyFormat(buffer))
				file = new BVRFile(buffer);

			if (file && file->valid) {
				SetFile(file);
				fhistory.Prepend_save(filepath.string());
				history_file_has_changed = 1; // used by main to know when to update the window title
				boardMinMaxDone          = false;
				m_rotation               = 0;
				m_current_side           = 0;
				EPCCheck(); // check to see we don't have a flipped board outline

				m_annotations.SetFilename(filepath.string());
				m_annotations.Load();

				auto conffilepath = filepath;
				conffilepath.replace_extension("conf");
				backgroundImage.loadFromConfig(conffilepath);

				/*
				 * Set pins to a known lower size, they get resized
				 * in DrawParts() when the component is analysed
				 */
				for (auto &p : m_board->Pins()) {
					//					auto p      = pin.get();
					p->diameter = 7;
				}

				CenterView();
				m_lastFileOpenWasInvalid = false;
				m_validBoard             = true;

			} else {
				m_validBoard = false;
				delete file;
			}
		}
	} else {
		return 1;
	}

	return 0;
}